

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

void Llb_NonlinVerifyScores(Llb_Mgr_t *p)

{
  int iVar1;
  int iVar2;
  Llb_Prt_t *pLVar3;
  Llb_Var_t *pLVar4;
  int local_2c;
  int local_28;
  int nScore;
  int k;
  int i;
  Llb_Var_t *pVar;
  Llb_Prt_t *pPart;
  Llb_Mgr_t *p_local;
  
  for (nScore = 0; nScore < p->iPartFree; nScore = nScore + 1) {
    pLVar3 = Llb_MgrPart(p,nScore);
    if ((pLVar3 != (Llb_Prt_t *)0x0) &&
       (iVar2 = pLVar3->nSize, iVar1 = Cudd_DagSize(pLVar3->bFunc), iVar2 != iVar1)) {
      __assert_fail("pPart->nSize == Cudd_DagSize(pPart->bFunc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                    ,0x329,"void Llb_NonlinVerifyScores(Llb_Mgr_t *)");
    }
  }
  nScore = 0;
  do {
    if (p->nVars <= nScore) {
      return;
    }
    pLVar4 = Llb_MgrVar(p,nScore);
    if (pLVar4 != (Llb_Var_t *)0x0) {
      local_2c = 0;
      for (local_28 = 0; iVar2 = Vec_IntSize(pLVar4->vParts), local_28 < iVar2;
          local_28 = local_28 + 1) {
        iVar2 = Vec_IntEntry(pLVar4->vParts,local_28);
        pLVar3 = Llb_MgrPart(p,iVar2);
        local_2c = pLVar3->nSize + local_2c;
      }
      if (local_2c != pLVar4->nScore) {
        __assert_fail("nScore == pVar->nScore",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                      ,0x32f,"void Llb_NonlinVerifyScores(Llb_Mgr_t *)");
      }
    }
    nScore = nScore + 1;
  } while( true );
}

Assistant:

void Llb_NonlinVerifyScores( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k, nScore;
    Llb_MgrForEachPart( p, pPart, i )
        assert( pPart->nSize == Cudd_DagSize(pPart->bFunc) );
    Llb_MgrForEachVar( p, pVar, i )
    {
        nScore = 0;
        Llb_VarForEachPart( p, pVar, pPart, k )
            nScore += pPart->nSize;
        assert( nScore == pVar->nScore );
    }
}